

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

string * __thiscall
google::GetCapturedTestOutput_abi_cxx11_(string *__return_storage_ptr__,google *this,int fd)

{
  bool bVar1;
  ostream *poVar2;
  pointer pCVar3;
  char *__filename;
  FILE *__p;
  pointer this_00;
  FILE *file_00;
  unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_> local_110;
  unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_> file;
  LogMessage local_100;
  LogMessageVoidify local_99;
  unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> local_98;
  unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> cap;
  LogMessage local_78;
  LogMessageVoidify local_15;
  int local_14;
  string *psStack_10;
  int fd_local;
  string *content;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 != 1 && local_14 != 2) {
    LogMessageVoidify::LogMessageVoidify(&local_15);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x181);
    poVar2 = LogMessage::stream(&local_78);
    poVar2 = std::operator<<(poVar2,"Check failed: fd == STDOUT_FILENO || fd == STDERR_FILENO ");
    LogMessageVoidify::operator&(&local_15,poVar2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
  }
  std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::unique_ptr
            (&local_98,
             (unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> *)
             (s_captured_streams + (long)local_14 * 8));
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_98);
  file._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
  super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    LogMessageVoidify::LogMessageVoidify(&local_99);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x183);
    file._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
    super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._7_1_ = 1;
    poVar2 = LogMessage::stream(&local_100);
    poVar2 = std::operator<<(poVar2,"Check failed: cap ");
    poVar2 = std::operator<<(poVar2,": did you forget CaptureTestStdout() or CaptureTestStderr()?");
    LogMessageVoidify::operator&(&local_99,poVar2);
  }
  if ((file._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
       super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
       super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._7_1_ & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_100);
  }
  pCVar3 = std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::
           operator->(&local_98);
  CapturedStream::StopCapture(pCVar3);
  pCVar3 = std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::
           operator->(&local_98);
  CapturedStream::filename_abi_cxx11_(pCVar3);
  __filename = (char *)std::__cxx11::string::c_str();
  __p = fopen(__filename,"r");
  std::unique_ptr<_IO_FILE,std::default_delete<_IO_FILE>>::
  unique_ptr<std::default_delete<_IO_FILE>,void>
            ((unique_ptr<_IO_FILE,std::default_delete<_IO_FILE>> *)&local_110,(pointer)__p);
  this_00 = std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::get(&local_110);
  ReadEntireFile_abi_cxx11_(__return_storage_ptr__,(google *)this_00,file_00);
  std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset(&local_110,(pointer)0x0);
  std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::~unique_ptr(&local_110);
  std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::~unique_ptr
            (&local_98);
  return __return_storage_ptr__;
}

Assistant:

static inline string GetCapturedTestOutput(int fd) {
  CHECK(fd == STDOUT_FILENO || fd == STDERR_FILENO);
  std::unique_ptr<CapturedStream> cap = std::move(s_captured_streams[fd]);
  CHECK(cap) << ": did you forget CaptureTestStdout() or CaptureTestStderr()?";

  // Make sure everything is flushed.
  cap->StopCapture();

  // Read the captured file.
  std::unique_ptr<FILE> file{fopen(cap->filename().c_str(), "r")};
  const string content = ReadEntireFile(file.get());
  file.reset();

  return content;
}